

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O1

void __thiscall tf::TFProfObserver::Summary::dump_tsum(Summary *this,ostream *os)

{
  vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
  *__last;
  size_t sVar1;
  ostream *poVar2;
  long lVar3;
  char *__s;
  anon_class_16_2_f9735b72 __f;
  size_t min_w;
  size_t max_w;
  size_t count_w;
  size_t avg_w;
  size_t time_w;
  char local_79;
  long local_78;
  long local_70;
  long local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_t local_40;
  long local_38;
  
  local_68 = 5;
  local_38 = 9;
  local_40 = 8;
  local_78 = 8;
  local_70 = 8;
  __last = &this->wsum;
  std::
  for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_1_>
            ((TaskSummary *)this,(TaskSummary *)__last,(anon_class_8_1_bc718827)&local_68);
  std::
  for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_2_>
            ((TaskSummary *)this,(TaskSummary *)__last,(anon_class_8_1_6d10d0c3)&local_38);
  __f.time_w = (size_t *)&local_38;
  __f.avg_w = &local_40;
  std::
  for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_3_>
            ((TaskSummary *)this,(TaskSummary *)__last,__f);
  std::
  for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_4_>
            ((TaskSummary *)this,(TaskSummary *)__last,(anon_class_8_1_a84b54ea)&local_78);
  std::
  for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_5_>
            ((TaskSummary *)this,(TaskSummary *)__last,(anon_class_8_1_a847d77c)&local_70);
  *(undefined8 *)(&os->field_0x10 + (long)os->_vptr_basic_ostream[-3]) = 10;
  std::__ostream_insert<char,std::char_traits<char>>(os,"-Task-",6);
  *(long *)(&os->field_0x10 + (long)os->_vptr_basic_ostream[-3]) = (long)((int)local_68 + 2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Count",5);
  *(long *)(&os->field_0x10 + (long)os->_vptr_basic_ostream[-3]) = (long)((int)local_38 + 2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Time (us)",9);
  *(long *)(&os->field_0x10 + (long)os->_vptr_basic_ostream[-3]) = (long)((int)local_40 + 2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Avg (us)",8);
  *(long *)(&os->field_0x10 + (long)os->_vptr_basic_ostream[-3]) = (long)((int)local_78 + 2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Min (us)",8);
  *(long *)(&os->field_0x10 + (long)os->_vptr_basic_ostream[-3]) = (long)((int)local_70 + 2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Max (us)",8);
  local_60._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_60,1);
  lVar3 = 0;
  do {
    if ((&(this->tsum)._M_elems[0].count)[lVar3] != 0) {
      *(undefined8 *)(&os->field_0x10 + (long)os->_vptr_basic_ostream[-3]) = 10;
      __s = "undefined";
      if ((ulong)*(uint *)((long)&TASK_TYPES + lVar3) < 7) {
        __s = (&PTR_anon_var_dwarf_75d41_0015b810)[*(uint *)((long)&TASK_TYPES + lVar3)];
      }
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
      *(long *)(&os->field_0x10 + (long)os->_vptr_basic_ostream[-3]) =
           (local_68 << 0x20) + 0x200000000 >> 0x20;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      *(long *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) =
           (local_38 << 0x20) + 0x200000000 >> 0x20;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      *(long *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) =
           (long)((local_40 << 0x20) + 0x200000000) >> 0x20;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_60,vsnprintf,0x3a,"%f",
                 (double)((float)(&(this->tsum)._M_elems[0].total_span)[lVar3] /
                         (float)(&(this->tsum)._M_elems[0].count)[lVar3]));
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                                  local_60._M_dataplus._M_p._0_1_),
                          local_60._M_string_length);
      *(long *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) =
           (local_78 << 0x20) + 0x200000000 >> 0x20;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      *(long *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) =
           (local_70 << 0x20) + 0x200000000 >> 0x20;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      local_79 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_79,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_),
                        local_60.field_2._M_allocated_capacity + 1);
      }
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x1c);
  return;
}

Assistant:

inline void TFProfObserver::Summary::dump_tsum(std::ostream& os) const {

  // task summary
  size_t type_w{10}, count_w{5}, time_w{9}, avg_w{8}, min_w{8}, max_w{8};

  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
	count_w = (std::max)(count_w, std::to_string(i.count).size());
  });
  
  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    time_w = (std::max)(time_w, std::to_string(i.total_span).size());
  });
  
  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    avg_w = (std::max)(time_w, std::to_string(i.avg_span()).size());
  });
  
  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    min_w = (std::max)(min_w, std::to_string(i.min_span).size());
  });
  
  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    max_w = (std::max)(max_w, std::to_string(i.max_span).size());
  });

  os << std::setw(type_w) << "-Task-" 
     << std::setw(count_w+2) << "Count"
     << std::setw(time_w+2) << "Time (us)"
     << std::setw(avg_w+2) << "Avg (us)"
     << std::setw(min_w+2) << "Min (us)"
     << std::setw(max_w+2) << "Max (us)"
     << '\n';

  for(size_t i=0; i<TASK_TYPES.size(); i++) {
    if(tsum[i].count == 0) {
      continue;
    }
    os << std::setw(type_w) << to_string(TASK_TYPES[i])
       << std::setw(count_w+2) << tsum[i].count
       << std::setw(time_w+2) << tsum[i].total_span
       << std::setw(avg_w+2) << std::to_string(tsum[i].avg_span())
       << std::setw(min_w+2) << tsum[i].min_span
       << std::setw(max_w+2) << tsum[i].max_span
       << '\n';
  }
}